

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StartsWithMatcher *
Catch::Matchers::StartsWith
          (StartsWithMatcher *__return_storage_ptr__,string *str,CaseSensitive caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StartsWithMatcher::StartsWithMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StartsWithMatcher StartsWith(std::string const &str, CaseSensitive caseSensitivity) {
            return StartsWithMatcher(CasedString(str, caseSensitivity));
        }